

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_187f8::testScanLineImage(Box2i *dataWindow,string *fileName)

{
  ostream *poVar1;
  Rand48 random;
  DeepImage img2;
  DeepImage img1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"scan lines, data window = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->min).x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->min).y);
  poVar1 = std::operator<<(poVar1,") - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->max).x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->max).y);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  Imf_3_2::DeepImage::DeepImage(&img1);
  Imf_3_2::Image::resize((Box *)&img1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&img2,"H1",(allocator<char> *)&random);
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,1,1,true);
  std::__cxx11::string::~string((string *)&img2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&img2,"H2",(allocator<char> *)&random);
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,1,1,true);
  std::__cxx11::string::~string((string *)&img2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&img2,"F",(allocator<char> *)&random)
  ;
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,2,1,true);
  std::__cxx11::string::~string((string *)&img2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&img2,"UI",(allocator<char> *)&random);
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,0,1,true);
  std::__cxx11::string::~string((string *)&img2);
  random._state[0] = 0x5a5a;
  random._state[1] = 0x5a5a;
  random._state[2] = 0x5a5a;
  poVar1 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::endl<char,std::char_traits<char>>(poVar1);
  fillChannels(&random,&img1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    saving file");
  std::endl<char,std::char_traits<char>>(poVar1);
  Imf_3_2::saveDeepScanLineImage((string *)fileName,&img1);
  Imf_3_2::DeepImage::DeepImage(&img2);
  poVar1 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::endl<char,std::char_traits<char>>(poVar1);
  Imf_3_2::loadDeepImage((string *)fileName,&img2);
  poVar1 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::endl<char,std::char_traits<char>>(poVar1);
  verifyImagesAreEqual(&img1,&img2,0,0);
  remove((fileName->_M_dataplus)._M_p);
  Imf_3_2::DeepImage::~DeepImage(&img2);
  Imf_3_2::DeepImage::~DeepImage(&img1);
  return;
}

Assistant:

void
testScanLineImage (const Box2i& dataWindow, const string& fileName)
{
    cout << "scan lines, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img1;
    img1.resize (dataWindow);

    img1.insertChannel ("H1", HALF, 1, 1, false);
    img1.insertChannel ("H2", HALF, 1, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveDeepScanLineImage (fileName, img1);

    DeepImage img2;

    cout << "    loading file" << endl;
    loadDeepImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str ());
}